

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::CoreMLModels::Gazetteer::Gazetteer(Gazetteer *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Gazetteer_0072dca0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (Gazetteer *)&_Gazetteer_default_instance_) {
    protobuf_Gazetteer_2eproto::InitDefaults();
  }
  CoreMLModels::Gazetteer((CoreMLModels *)this);
  return;
}

Assistant:

Gazetteer::Gazetteer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Gazetteer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.CoreMLModels.Gazetteer)
}